

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v3::motion_io::import_bone_motions
          (motion_io *this,xr_reader *r,xr_bone_vec *all_bones)

{
  bool bVar1;
  uint32_t uVar2;
  size_type __n;
  xr_bone_motion *this_00;
  reference ppxVar3;
  string *psVar4;
  string *this_01;
  xr_bone_motion *local_58 [3];
  xr_bone_motion *local_40;
  bone_motion_io *bm;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  uint_fast32_t num_keys;
  xr_bone_vec *all_bones_local;
  xr_reader *r_local;
  motion_io *this_local;
  
  uVar2 = xr_reader::r_u32(r);
  (this->super_xr_skl_motion).super_xr_motion.m_frame_start = 0;
  (this->super_xr_skl_motion).super_xr_motion.m_frame_end = uVar2 & 0x7fffffff;
  bVar1 = std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::empty
                    (&(this->super_xr_skl_motion).m_bone_motions);
  if (!bVar1) {
    __assert_fail("m_bone_motions.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x11f,
                  "void xray_re::xr_ogf_v3::motion_io::import_bone_motions(xr_reader &, xr_bone_vec &)"
                 );
  }
  __n = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::size(all_bones);
  std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::reserve
            (&(this->super_xr_skl_motion).m_bone_motions,__n);
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin(all_bones);
  bm = (bone_motion_io *)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end(all_bones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
                             *)&bm);
    if (!bVar1) break;
    this_00 = (xr_bone_motion *)operator_new(0x60);
    bone_motion_io::bone_motion_io((bone_motion_io *)this_00);
    local_40 = this_00;
    ppxVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    psVar4 = xr_bone::name_abi_cxx11_(*ppxVar3);
    this_01 = xr_bone_motion::name_abi_cxx11_(local_40);
    std::__cxx11::string::operator=((string *)this_01,(string *)psVar4);
    bone_motion_io::import((bone_motion_io *)local_40,r,(ulong)uVar2);
    local_58[0] = local_40;
    std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::push_back
              (&(this->super_xr_skl_motion).m_bone_motions,local_58);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_ogf_v3::motion_io::import_bone_motions(xr_reader& r, xr_bone_vec& all_bones)
{
	uint_fast32_t num_keys = r.r_u32();
	m_frame_start = 0;
	m_frame_end = int32_t(num_keys & INT32_MAX);

	assert(m_bone_motions.empty());
	m_bone_motions.reserve(all_bones.size());
	for (xr_bone_vec_it it = all_bones.begin(), end = all_bones.end(); it != end; ++it) {
		xr_ogf_v3::bone_motion_io* bm = new xr_ogf_v3::bone_motion_io;
		bm->name() = (*it)->name();
		bm->import(r, num_keys);
		m_bone_motions.push_back(bm);
	}
}